

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_5,_5>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  bool bVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Matrix<float,_2,_2> retVal;
  float local_44 [3];
  Type in0;
  Type in1;
  int aiStack_18 [6];
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    in0.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
    in0.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    in0.m_data.m_data[1].m_data[0] = (float)uVar1;
    in0.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    in0.m_data.m_data[0].m_data[0] = -0.1;
    in0.m_data.m_data[0].m_data[1] = -0.2;
    in0.m_data.m_data[1].m_data[0] = 1.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    in1.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
    in1.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
    in1.m_data.m_data[1].m_data[0] = (float)uVar1;
    in1.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  }
  else {
    in1.m_data.m_data[0].m_data[0] = 0.8;
    in1.m_data.m_data[0].m_data[1] = 0.5;
    in1.m_data.m_data[1].m_data[0] = 0.1;
    in1.m_data.m_data[1].m_data[1] = -0.9;
  }
  pfVar5 = (float *)&retVal;
  pfVar6 = (float *)&in1;
  pfVar7 = (float *)&in0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    *pfVar5 = *pfVar7 * *pfVar6;
    pfVar5[2] = pfVar7[2] * pfVar6[2];
    pfVar5 = retVal.m_data.m_data[0].m_data + 1;
    pfVar6 = in1.m_data.m_data[0].m_data + 1;
    pfVar7 = in0.m_data.m_data[0].m_data + 1;
    bVar2 = false;
  } while (bVar4);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar3]] = retVal.m_data.m_data[1].m_data[lVar3 + 1];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}